

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

void VP8InitDithering(WebPDecoderOptions *options,VP8Decoder *dec)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  if (options != (WebPDecoderOptions *)0x0) {
    uVar3 = options->dithering_strength;
    if ((-1 < (int)uVar3) &&
       ((uVar1 = 0xff, 100 < uVar3 || (uVar1 = (uVar3 * 0xff & 0xffff) / 100, uVar3 != 0)))) {
      uVar3 = 0;
      for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 0x20) {
        uVar5 = *(uint *)((long)dec->dqm[0].uv_mat + lVar4 + 8);
        if ((int)uVar5 < 0xc) {
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          uVar5 = "\b\a\x06\x04\x04\x02\x02\x02\x01\x01\x01\x01"[uVar5] * uVar1 >> 3;
          *(uint *)((long)dec->dqm[0].uv_mat + lVar4 + 0xc) = uVar5;
        }
        else {
          uVar5 = *(uint *)((long)dec->dqm[0].uv_mat + lVar4 + 0xc);
        }
        uVar3 = uVar3 | uVar5;
      }
      if (uVar3 != 0) {
        VP8InitRandom(&dec->dithering_rg,1.0);
        dec->dither = 1;
      }
    }
    iVar2 = options->alpha_dithering_strength;
    dec->alpha_dithering = iVar2;
    if (iVar2 < 0x65) {
      if (-1 < iVar2) {
        return;
      }
      iVar2 = 0;
    }
    else {
      iVar2 = 100;
    }
    dec->alpha_dithering = iVar2;
  }
  return;
}

Assistant:

void VP8InitDithering(const WebPDecoderOptions* const options,
                      VP8Decoder* const dec) {
  assert(dec != NULL);
  if (options != NULL) {
    const int d = options->dithering_strength;
    const int max_amp = (1 << VP8_RANDOM_DITHER_FIX) - 1;
    const int f = (d < 0) ? 0 : (d > 100) ? max_amp : (d * max_amp / 100);
    if (f > 0) {
      int s;
      int all_amp = 0;
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        VP8QuantMatrix* const dqm = &dec->dqm[s];
        if (dqm->uv_quant < DITHER_AMP_TAB_SIZE) {
          const int idx = (dqm->uv_quant < 0) ? 0 : dqm->uv_quant;
          dqm->dither = (f * kQuantToDitherAmp[idx]) >> 3;
        }
        all_amp |= dqm->dither;
      }
      if (all_amp != 0) {
        VP8InitRandom(&dec->dithering_rg, 1.0f);
        dec->dither = 1;
      }
    }
    // potentially allow alpha dithering
    dec->alpha_dithering = options->alpha_dithering_strength;
    if (dec->alpha_dithering > 100) {
      dec->alpha_dithering = 100;
    } else if (dec->alpha_dithering < 0) {
      dec->alpha_dithering = 0;
    }
  }
}